

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_> __thiscall
wabt::MakeUnique<wabt::TableCopyExpr,wabt::Var,wabt::Var>(wabt *this,Var *args,Var *args_1)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0xd0);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0x2d;
  *puVar1 = &PTR__TableCopyExpr_001c0880;
  Var::Var((Var *)(puVar1 + 8),args);
  Var::Var((Var *)(puVar1 + 0x11),args_1);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>,_true,_true>
         )(__uniq_ptr_data<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}